

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xr_entity_factory.cxx
# Opt level: O3

cse_abstract * __thiscall xr_entity_factory::create(xr_entity_factory *this,char *name)

{
  pointer ppfVar1;
  ulong uVar2;
  bool bVar3;
  int iVar4;
  xr_ini_file *this_00;
  undefined4 extraout_var;
  pointer ppfVar6;
  ulong uVar7;
  xr_clsid clsid;
  char clsid_name [9];
  anon_union_8_3_e9edf90f_for_xr_clsid_0 local_30;
  char local_28 [16];
  cse_abstract *pcVar5;
  
  this_00 = this->m_system_ini;
  if (this_00 == (xr_ini_file *)0x0) {
    this_00 = (xr_ini_file *)operator_new(0x18);
    (this_00->m_sections).
    super__Vector_base<xray_re::xr_ini_file::ini_section_*,_std::allocator<xray_re::xr_ini_file::ini_section_*>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    (this_00->m_sections).
    super__Vector_base<xray_re::xr_ini_file::ini_section_*,_std::allocator<xray_re::xr_ini_file::ini_section_*>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    (this_00->m_sections).
    super__Vector_base<xray_re::xr_ini_file::ini_section_*,_std::allocator<xray_re::xr_ini_file::ini_section_*>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    xray_re::xr_ini_file::load(this_00,"$game_config$","system.ltx");
    this->m_system_ini = this_00;
  }
  bVar3 = xray_re::xr_ini_file::section_exist(this_00,name);
  if (bVar3) {
    local_30.quad = xray_re::xr_ini_file::r_clsid(this->m_system_ini,name,"class");
    ppfVar6 = (this->m_clsids).
              super__Vector_base<factory_item_base_*,_std::allocator<factory_item_base_*>_>._M_impl.
              super__Vector_impl_data._M_start;
    ppfVar1 = (this->m_clsids).
              super__Vector_base<factory_item_base_*,_std::allocator<factory_item_base_*>_>._M_impl.
              super__Vector_impl_data._M_finish;
    uVar7 = (long)ppfVar1 - (long)ppfVar6 >> 3;
    while (uVar2 = uVar7, 0 < (long)uVar2) {
      uVar7 = uVar2 >> 1;
      if ((ppfVar6[uVar7]->m_clsid).field_0.quad < local_30.quad) {
        ppfVar6 = ppfVar6 + uVar7 + 1;
        uVar7 = ~uVar7 + uVar2;
      }
    }
    if ((ppfVar6 == ppfVar1) || (((*ppfVar6)->m_clsid).field_0.quad != local_30.quad)) {
      local_28[8] = 0;
      local_28[0] = '\0';
      local_28[1] = '\0';
      local_28[2] = '\0';
      local_28[3] = '\0';
      local_28[4] = '\0';
      local_28[5] = '\0';
      local_28[6] = '\0';
      local_28[7] = '\0';
      xray_re::xr_clsid::get((xr_clsid *)&local_30,local_28);
      pcVar5 = (cse_abstract *)0x0;
      xray_re::msg("can\'t create entity %s, %s",name,local_28);
    }
    else {
      iVar4 = (*(*ppfVar6)->_vptr_factory_item_base[2])();
      pcVar5 = (cse_abstract *)CONCAT44(extraout_var,iVar4);
    }
  }
  else {
    pcVar5 = (cse_abstract *)0x0;
    xray_re::msg("can\'t find entity %s",name);
  }
  return pcVar5;
}

Assistant:

cse_abstract* xr_entity_factory::create(const char* name)
{
	if (m_system_ini == 0)
		m_system_ini = new xr_ini_file(PA_GAME_CONFIG, "system.ltx");

	if (!m_system_ini->section_exist(name)) {
		msg("can't find entity %s", name);
		return 0;
	}

	xr_clsid clsid(m_system_ini->r_clsid(name, "class"));
	std::vector<factory_item_base*>::iterator it = lower_bound_if(
			m_clsids.begin(), m_clsids.end(), clsid_pred2(clsid));
	if (it != m_clsids.end() && (*it)->clsid() == clsid)
		return (*it)->create();

	char clsid_name[9] = {};
	clsid.get(clsid_name);
	msg("can't create entity %s, %s", name, clsid_name);
	return 0;
}